

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void ramdump(uint32_t base_address,uint32_t size)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint in_ESI;
  int in_EDI;
  access_type_t unaff_retaddr;
  uint32_t unaff_retaddr_00;
  uint16_t h;
  uint16_t g;
  uint16_t f;
  uint16_t e;
  uint16_t d;
  uint16_t c;
  uint16_t b;
  uint16_t a;
  int x;
  _Bool allzeroes;
  uint local_18;
  
  bVar1 = true;
  for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 0x10) {
    uVar2 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    uVar3 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    uVar4 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    uVar5 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    uVar6 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    uVar7 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    uVar8 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    uVar9 = gba_read_half(unaff_retaddr_00,unaff_retaddr);
    if (((((uVar2 != 0) || (uVar3 != 0)) || (uVar4 != 0)) || ((uVar5 != 0 || (uVar6 != 0)))) ||
       ((uVar7 != 0 || ((uVar8 != 0 || (uVar9 != 0)))))) {
      bVar1 = false;
    }
    printf("%08X: %04X %04X %04X %04X %04X %04X %04X %04X\n",(ulong)(in_EDI + local_18),(ulong)uVar2
           ,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,(uint)uVar6,(uint)uVar7,(uint)uVar8,(uint)uVar9);
  }
  if (bVar1) {
    printf("Warning: all zeroes!\n");
  }
  return;
}

Assistant:

void ramdump(word base_address, word size) {
    bool allzeroes = true;
    for (int x = 0; x < size; x += 0x10) {
        half a = gba_read_half(base_address + x, ACCESS_UNKNOWN);
        half b = gba_read_half(base_address + x + 0x2, ACCESS_UNKNOWN);
        half c = gba_read_half(base_address + x + 0x4, ACCESS_UNKNOWN);
        half d = gba_read_half(base_address + x + 0x6, ACCESS_UNKNOWN);
        half e = gba_read_half(base_address + x + 0x8, ACCESS_UNKNOWN);
        half f = gba_read_half(base_address + x + 0xA, ACCESS_UNKNOWN);
        half g = gba_read_half(base_address + x + 0xC, ACCESS_UNKNOWN);
        half h = gba_read_half(base_address + x + 0xE, ACCESS_UNKNOWN);
        if (a != 0 || b != 0 || c != 0 || d != 0 || e != 0 || f != 0 || g != 0 || h != 0) {
            allzeroes = false;
        }
        printf("%08X: %04X %04X %04X %04X %04X %04X %04X %04X\n",
               base_address + x, a, b, c, d, e, f, g, h);
    }
    if (allzeroes) {
        printf("Warning: all zeroes!\n");
    }
}